

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fs_log_store.cxx
# Opt level: O0

ulong __thiscall cornerstone::fs_log_store::next_slot(fs_log_store *this)

{
  mutex_type *pmVar1;
  mutex_type *pmVar2;
  lock_guard<std::recursive_mutex> *in_RDI;
  lock_guard<std::recursive_mutex> guard;
  mutex_type *in_stack_ffffffffffffffd8;
  
  std::lock_guard<std::recursive_mutex>::lock_guard(in_RDI,in_stack_ffffffffffffffd8);
  pmVar1 = in_RDI[200]._M_device;
  pmVar2 = in_RDI[199]._M_device;
  std::lock_guard<std::recursive_mutex>::~lock_guard((lock_guard<std::recursive_mutex> *)0x1b1236);
  return (long)&(pmVar1->super___recursive_mutex_base)._M_mutex +
         (long)&(pmVar2->super___recursive_mutex_base)._M_mutex;
}

Assistant:

ulong fs_log_store::next_slot() const
{
    recur_lock(store_lock_);
    return start_idx_ + entries_in_store_;
}